

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O3

void * coll_seq_remove_at(coll_seq_t *seq,size_t index)

{
  coll_seq_node_t *pcVar1;
  coll_seq_node_t *__ptr;
  void *pvVar2;
  
  if ((seq == (coll_seq_t *)0x0) || (seq->len <= index)) {
    pvVar2 = (void *)0x0;
  }
  else {
    __ptr = seq->head;
    if (index == 0) {
      seq->head = __ptr->next;
    }
    else {
      do {
        pcVar1 = __ptr;
        __ptr = pcVar1->next;
        index = index - 1;
      } while (index != 0);
      pcVar1->next = __ptr->next;
    }
    pvVar2 = __ptr->data;
    free(__ptr);
    seq->len = seq->len - 1;
  }
  return pvVar2;
}

Assistant:

void *coll_seq_remove_at(coll_seq_t *seq, size_t index) {
    if (!seq || index >= seq->len) {
        return NULL;
    }
    node_t *prev = NULL, *cur = seq->head;
    for (size_t i = 0; i < index; ++i) {
        prev = cur;
        cur = cur->next;
    }
    if (prev) {
        prev->next = cur->next;
    } else {
        seq->head = cur->next;
    }
    void *data = cur->data;
    free(cur);
    --(seq->len);
    return data;
}